

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Stats::getVectorError(Stats *this,int index)

{
  reference pvVar1;
  int in_EDX;
  long in_RSI;
  Vector3d *in_RDI;
  Vector3d *value;
  ResultType *in_stack_00000048;
  VectorAccumulator *in_stack_00000050;
  
  Vector3<double>::Vector3((Vector3<double> *)0x37b29e);
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  if (pvVar1->accumulator != (BaseAccumulator *)0x0) {
    __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
  }
  VectorAccumulator::get95percentConfidenceInterval(in_stack_00000050,in_stack_00000048);
  return in_RDI;
}

Assistant:

Vector3d Stats::getVectorError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Vector3d value;
    dynamic_cast<VectorAccumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }